

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_common.h
# Opt level: O3

const_bf_iterator *
bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
          (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *t)

{
  int iVar1;
  
  if (bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>(st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>const&)
      ::j == '\0') {
    iVar1 = __cxa_guard_acquire(&bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>(st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>const&)
                                 ::j);
    if (iVar1 != 0) {
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j.
      _vptr_b1st_iterator = (_func_int **)&PTR__b1st_iterator_0030a5d8;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_map_size = 0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j._queue.
      super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      std::
      _Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
      ::_M_initialize_map(&bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>
                           ::j._queue.
                           super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
                          ,0);
      __cxa_atexit(st_tree::detail::
                   b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
                   ::~b1st_iterator,
                   &bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>
                    ::j,&__dso_handle);
      __cxa_guard_release(&bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>(st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>const&)
                           ::j);
    }
  }
  return &bf_j<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>_>::j;
}

Assistant:

typename Tree::const_bf_iterator& bf_j(const Tree& t) {
    static typename Tree::const_bf_iterator j;
    return j;
}